

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O3

bool icu_63::double_conversion::AdvanceToNonspace<unsigned_short_const*>
               (unsigned_short **current,unsigned_short *end)

{
  ushort uVar1;
  ushort *puVar2;
  long lVar3;
  
  puVar2 = *current;
  do {
    if (puVar2 == end) {
      return false;
    }
    uVar1 = *puVar2;
    lVar3 = 0;
    if (uVar1 < 0x80) {
      while ((int)(char)(&kWhitespaceTable7)[lVar3] != (uint)uVar1) {
        lVar3 = lVar3 + 1;
        if (lVar3 == 6) {
          return true;
        }
      }
    }
    else {
      while (*(ushort *)((long)&kWhitespaceTable16 + lVar3) != uVar1) {
        lVar3 = lVar3 + 2;
        if (lVar3 == 0x28) {
          return true;
        }
      }
    }
    puVar2 = puVar2 + 1;
    *current = puVar2;
  } while( true );
}

Assistant:

static inline bool AdvanceToNonspace(Iterator* current, Iterator end) {
  while (*current != end) {
    if (!isWhitespace(**current)) return true;
    ++*current;
  }
  return false;
}